

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O3

float32 helper_recpsf_f32_aarch64(float32 a,float32 b,void *fpstp)

{
  float32 fVar1;
  float32 xb;
  
  fVar1 = float32_squash_input_denormal_aarch64(a,(float_status *)fpstp);
  xb = float32_squash_input_denormal_aarch64(b,(float_status *)fpstp);
  if (((fVar1 & 0x7fffffff) != 0x7f800000 || (xb & 0x7fffffff) != 0) &&
     ((fVar1 & 0x7fffffff) != 0 || (xb & 0x7fffffff) != 0x7f800000)) {
    fVar1 = float32_muladd_aarch64(fVar1 + 0x80000000,xb,0x40000000,0,(float_status *)fpstp);
    return fVar1;
  }
  return 0x40000000;
}

Assistant:

float32 HELPER(recpsf_f32)(float32 a, float32 b, void *fpstp)
{
    float_status *fpst = fpstp;

    a = float32_squash_input_denormal(a, fpst);
    b = float32_squash_input_denormal(b, fpst);

    a = float32_chs(a);
    if ((float32_is_infinity(a) && float32_is_zero(b)) ||
        (float32_is_infinity(b) && float32_is_zero(a))) {
        return float32_two;
    }
    return float32_muladd(a, b, float32_two, 0, fpst);
}